

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O0

void lyd_np_cont_dflt_set(lyd_node *parent)

{
  lyd_node *local_18;
  lyd_node *child;
  lyd_node *parent_local;
  
  child = parent;
  while( true ) {
    if (((((child == (lyd_node *)0x0) || (child->schema == (lysc_node *)0x0)) ||
         ((child->flags & 1) != 0)) ||
        ((child->schema == (lysc_node *)0x0 || (child->schema->nodetype != 1)))) ||
       ((child->schema->flags & 0x80) != 0)) {
      return;
    }
    for (local_18 = lyd_child(child); (local_18 != (lyd_node *)0x0 && ((local_18->flags & 1) != 0));
        local_18 = local_18->next) {
    }
    if (local_18 != (lyd_node *)0x0) break;
    child->flags = child->flags | 1;
    child = lyd_parent(child);
  }
  return;
}

Assistant:

void
lyd_np_cont_dflt_set(struct lyd_node *parent)
{
    const struct lyd_node *child;

    while (parent) {
        if (!parent->schema || (parent->flags & LYD_DEFAULT) || !lysc_is_np_cont(parent->schema)) {
            /* not a non-dflt NP container */
            break;
        }

        LY_LIST_FOR(lyd_child(parent), child) {
            if (!(child->flags & LYD_DEFAULT)) {
                break;
            }
        }
        if (child) {
            /* explicit child, no dflt change */
            break;
        }

        /* set the dflt flag */
        parent->flags |= LYD_DEFAULT;

        /* check all parent containers */
        parent = lyd_parent(parent);
    }
}